

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcolr.c
# Opt level: O1

FT_Bool tt_face_get_colr_layer
                  (TT_Face face,FT_UInt base_glyph,FT_UInt *aglyph_index,FT_UInt *acolor_index,
                  FT_LayerIterator *iterator)

{
  ushort uVar1;
  void *pvVar2;
  ushort *puVar3;
  long lVar4;
  bool bVar5;
  ushort uVar6;
  ushort in_R10W;
  ushort in_R11W;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  
  pvVar2 = face->colr;
  if (pvVar2 == (void *)0x0) {
    return '\0';
  }
  if (iterator->p == (FT_Byte *)0x0) {
    iterator->layer = 0;
    lVar4 = *(long *)((long)pvVar2 + 8);
    uVar12 = 0;
    uVar9 = (uint)*(ushort *)((long)pvVar2 + 2);
    do {
      uVar8 = uVar9;
      uVar10 = uVar12;
      if (uVar8 < uVar10 || uVar8 - uVar10 == 0) break;
      uVar9 = (uVar8 - uVar10 >> 1) + uVar10;
      uVar7 = (ulong)(uVar9 * 6);
      uVar11 = (uint)(ushort)(*(ushort *)(lVar4 + uVar7) << 8 | *(ushort *)(lVar4 + uVar7) >> 8);
      if (uVar11 < base_glyph) {
        bVar5 = true;
        uVar12 = uVar9 + 1;
        uVar9 = uVar8;
      }
      else {
        bVar5 = true;
        uVar12 = uVar10;
        if (uVar11 <= base_glyph) {
          uVar6 = *(ushort *)(lVar4 + 2 + uVar7);
          uVar1 = *(ushort *)(lVar4 + 4 + uVar7);
          in_R10W = uVar6 << 8 | uVar6 >> 8;
          in_R11W = uVar1 << 8 | uVar1 >> 8;
          bVar5 = false;
          uVar9 = uVar8;
        }
      }
    } while (bVar5);
    if (uVar8 <= uVar10) {
      return '\0';
    }
    if (in_R11W == 0) {
      return '\0';
    }
    iterator->num_layers = (uint)in_R11W;
    if (*(ulong *)((long)pvVar2 + 0x88) < (ulong)(((uint)in_R11W + (uint)in_R10W) * 4)) {
      return '\0';
    }
    iterator->p = (FT_Byte *)((ulong)in_R10W * 4 + *(long *)((long)pvVar2 + 0x10));
  }
  if (((iterator->layer < iterator->num_layers) &&
      (puVar3 = (ushort *)iterator->p, *(ushort **)((long)pvVar2 + 0x10) <= puVar3)) &&
     (puVar3 < (ushort *)(*(long *)((long)pvVar2 + 0x80) + *(long *)((long)pvVar2 + 0x88)))) {
    iterator->p = (FT_Byte *)(puVar3 + 1);
    *aglyph_index = (uint)(ushort)(*puVar3 << 8 | *puVar3 >> 8);
    iterator->p = (FT_Byte *)(puVar3 + 2);
    uVar6 = puVar3[1] << 8 | puVar3[1] >> 8;
    *acolor_index = (uint)uVar6;
    if ((*aglyph_index < (uint)(face->root).num_glyphs) &&
       ((uVar6 == 0xffff || (uVar6 < (face->palette_data).num_palette_entries)))) {
      iterator->layer = iterator->layer + 1;
      return '\x01';
    }
  }
  return '\0';
}

Assistant:

FT_LOCAL_DEF( FT_Bool )
  tt_face_get_colr_layer( TT_Face            face,
                          FT_UInt            base_glyph,
                          FT_UInt           *aglyph_index,
                          FT_UInt           *acolor_index,
                          FT_LayerIterator*  iterator )
  {
    Colr*            colr = (Colr*)face->colr;
    BaseGlyphRecord  glyph_record;


    if ( !colr )
      return 0;

    if ( !iterator->p )
    {
      FT_ULong  offset;


      /* first call to function */
      iterator->layer = 0;

      if ( !find_base_glyph_record( colr->base_glyphs,
                                    colr->num_base_glyphs,
                                    base_glyph,
                                    &glyph_record ) )
        return 0;

      if ( glyph_record.num_layers )
        iterator->num_layers = glyph_record.num_layers;
      else
        return 0;

      offset = LAYER_SIZE * glyph_record.first_layer_index;
      if ( offset + LAYER_SIZE * glyph_record.num_layers > colr->table_size )
        return 0;

      iterator->p = colr->layers + offset;
    }

    if ( iterator->layer >= iterator->num_layers                     ||
         iterator->p < colr->layers                                  ||
         iterator->p >= ( (FT_Byte*)colr->table + colr->table_size ) )
      return 0;

    *aglyph_index = FT_NEXT_USHORT( iterator->p );
    *acolor_index = FT_NEXT_USHORT( iterator->p );

    if ( *aglyph_index >= (FT_UInt)( FT_FACE( face )->num_glyphs )   ||
         ( *acolor_index != 0xFFFF                                 &&
           *acolor_index >= face->palette_data.num_palette_entries ) )
      return 0;

    iterator->layer++;

    return 1;
  }